

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O0

void helicsFederateSetQueryCallback
               (HelicsFederate fed,_func_void_char_ptr_int_HelicsQueryBuffer_void_ptr *queryAnswer,
               void *userdata,HelicsError *err)

{
  Federate *pFVar1;
  long in_RSI;
  Federate *fedptr;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff60;
  HelicsError *in_stack_ffffffffffffff68;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff70;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffffa8;
  Federate *in_stack_ffffffffffffffb0;
  
  pFVar1 = getFed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == 0) {
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
      ::function(in_stack_ffffffffffffff60);
      helics::Federate::setQueryCallback(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x1f0e06);
    }
    else {
      std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
      function<helicsFederateSetQueryCallback::__0,void>
                (in_stack_ffffffffffffff70,(anon_class_16_2_be705406 *)in_stack_ffffffffffffff68);
      helics::Federate::setQueryCallback(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x1f0e79);
    }
  }
  return;
}

Assistant:

void helicsFederateSetQueryCallback(HelicsFederate fed,
                                    void (*queryAnswer)(const char* query, int querySize, HelicsQueryBuffer buffer, void* userdata),
                                    void* userdata,
                                    HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (queryAnswer == nullptr) {
            fedptr->setQueryCallback({});
        } else {
            fedptr->setQueryCallback([queryAnswer, userdata](std::string_view query) {
                std::string buffer(1, '>');
                queryAnswer(query.data(), static_cast<int>(query.size()), &buffer, userdata);
                buffer.pop_back();
                return buffer;
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}